

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall
wasm::PrintExpressionContents::visitArrayNew(PrintExpressionContents *this,ArrayNew *curr)

{
  HeapType type;
  string_view str;
  string_view str_00;
  
  str._M_str = "array.new";
  str._M_len = 9;
  printMedium(this->o,str);
  if (curr->init == (Expression *)0x0) {
    str_00._M_str = "_default";
    str_00._M_len = 8;
    printMedium(this->o,str_00);
  }
  std::operator<<(this->o,' ');
  type = wasm::Type::getHeapType
                   (&(curr->super_SpecificExpression<(wasm::Expression::Id)70>).super_Expression.
                     type);
  printHeapTypeName(this,type);
  return;
}

Assistant:

void visitArrayNew(ArrayNew* curr) {
    printMedium(o, "array.new");
    if (curr->isWithDefault()) {
      printMedium(o, "_default");
    }
    o << ' ';
    printHeapTypeName(curr->type.getHeapType());
  }